

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O3

void * align_malloc(int i_size)

{
  void *pvVar1;
  void *__s;
  
  pvVar1 = malloc((long)i_size + 0x27);
  if (pvVar1 != (void *)0x0) {
    __s = (void *)((long)pvVar1 + 0x27U & 0xffffffffffffffe0);
    *(void **)((long)__s + -8) = pvVar1;
    pvVar1 = memset(__s,0,(long)i_size);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void *align_malloc(int i_size)
{
    int mask = ALIGN_BASIC - 1;
    u8 *align_buf = NULL;
    u8 *buf = (u8 *)malloc(i_size + mask + sizeof(void **));
    
    if (buf) {
        align_buf = buf + mask + sizeof(void **);
        align_buf -= (intptr_t)align_buf & mask;
        *(((void **)align_buf) - 1) = buf;
        memset(align_buf, 0, i_size);
    } 
    return align_buf;
}